

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_integral.cpp
# Opt level: O3

void duckdb::IntegralCompressFunction<unsigned_short,unsigned_int>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  VectorType VVar1;
  ushort uVar2;
  idx_t count;
  int *piVar3;
  ushort *puVar4;
  unsigned_long *puVar5;
  data_ptr_t pdVar6;
  allocate_function_ptr_t p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  data_ptr_t pdVar8;
  ulong uVar9;
  byte bVar10;
  element_type *peVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  SelectionVector *pSVar13;
  reference pvVar14;
  VectorBuffer *pVVar15;
  TemplatedValidityData<unsigned_long> *pTVar16;
  _Head_base<0UL,_unsigned_long_*,_false> _Var17;
  idx_t iVar18;
  idx_t iVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  idx_t idx_in_entry;
  ulong uVar25;
  optional_idx dict_size;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  Vector *local_90;
  buffer_ptr<VectorBuffer> *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  
  pvVar14 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  uVar2 = *(ushort *)pvVar14->data;
  pvVar14 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  VVar1 = pvVar14->vector_type;
  uVar21 = (uint)uVar2;
  if (VVar1 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar6 = result->data;
    pdVar8 = pvVar14->data;
    FlatVector::VerifyFlatVector(pvVar14);
    FlatVector::VerifyFlatVector(result);
    puVar5 = (pvVar14->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar5 == (unsigned_long *)0x0) {
      if (count != 0) {
        iVar19 = 0;
        do {
          *(uint *)(pdVar6 + iVar19 * 4) = *(ushort *)(pdVar8 + iVar19 * 2) - uVar21;
          iVar19 = iVar19 + 1;
        } while (count != iVar19);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar5;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(pvVar14->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (pvVar14->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < count + 0x3f) {
        puVar5 = (pvVar14->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        uVar20 = 0;
        uVar25 = 0;
        do {
          if (puVar5 == (unsigned_long *)0x0) {
            uVar23 = uVar25 + 0x40;
            if (count <= uVar25 + 0x40) {
              uVar23 = count;
            }
LAB_013ce6fd:
            uVar22 = uVar25;
            if (uVar25 < uVar23) {
              do {
                *(uint *)(pdVar6 + uVar25 * 4) = *(ushort *)(pdVar8 + uVar25 * 2) - uVar21;
                uVar25 = uVar25 + 1;
                uVar22 = uVar23;
              } while (uVar23 != uVar25);
            }
          }
          else {
            uVar9 = puVar5[uVar20];
            uVar23 = uVar25 + 0x40;
            if (count <= uVar25 + 0x40) {
              uVar23 = count;
            }
            uVar22 = uVar23;
            if (uVar9 != 0) {
              if (uVar9 == 0xffffffffffffffff) goto LAB_013ce6fd;
              uVar22 = uVar25;
              if (uVar25 < uVar23) {
                uVar24 = 0;
                do {
                  if ((uVar9 >> (uVar24 & 0x3f) & 1) != 0) {
                    *(uint *)(pdVar6 + uVar24 * 4 + uVar25 * 4) =
                         *(ushort *)(pdVar8 + uVar24 * 2 + uVar25 * 2) - uVar21;
                  }
                  uVar24 = uVar24 + 1;
                  uVar22 = uVar23;
                } while (uVar23 - uVar25 != uVar24);
              }
            }
          }
          uVar20 = uVar20 + 1;
          uVar25 = uVar22;
        } while (uVar20 != count + 0x3f >> 6);
      }
    }
  }
  else {
    if (VVar1 == DICTIONARY_VECTOR) {
      DictionaryVector::VerifyDictionary(pvVar14);
      pVVar15 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar14->buffer);
      local_78.sel = (SelectionVector *)pVVar15[1].data.allocator.ptr;
      if (((Allocator *)local_78.sel != (Allocator *)0xffffffffffffffff) &&
         (iVar19 = optional_idx::GetIndex((optional_idx *)&local_78), iVar19 * 2 <= count)) {
        DictionaryVector::VerifyDictionary(pvVar14);
        pVVar15 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&pvVar14->auxiliary);
        if (*(char *)&pVVar15[1]._vptr_VectorBuffer == '\0') {
          local_90 = (Vector *)(pVVar15 + 1);
          pdVar6 = result->data;
          pdVar8 = pVVar15[1].data.pointer;
          local_88 = &pvVar14->buffer;
          iVar19 = optional_idx::GetIndex((optional_idx *)&local_78);
          FlatVector::VerifyFlatVector(local_90);
          FlatVector::VerifyFlatVector(result);
          puVar5 = (unsigned_long *)pVVar15[1].data.allocated_size;
          if (puVar5 == (unsigned_long *)0x0) {
            if (iVar19 != 0) {
              iVar18 = 0;
              do {
                *(uint *)(pdVar6 + iVar18 * 4) = *(ushort *)(pdVar8 + iVar18 * 2) - uVar21;
                iVar18 = iVar18 + 1;
              } while (iVar19 != iVar18);
            }
          }
          else {
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar5;
            shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                      (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                       (shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                       (pVVar15 + 2));
            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
                 (idx_t)pVVar15[2].aux_data.
                        super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
                        .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
            if (0x3f < iVar19 + 0x3f) {
              iVar18 = pVVar15[1].data.allocated_size;
              uVar20 = 0;
              uVar25 = 0;
              do {
                if (iVar18 == 0) {
                  uVar23 = uVar25 + 0x40;
                  if (iVar19 <= uVar25 + 0x40) {
                    uVar23 = iVar19;
                  }
LAB_013ce8b4:
                  uVar22 = uVar25;
                  if (uVar25 < uVar23) {
                    do {
                      *(uint *)(pdVar6 + uVar25 * 4) = *(ushort *)(pdVar8 + uVar25 * 2) - uVar21;
                      uVar25 = uVar25 + 1;
                      uVar22 = uVar23;
                    } while (uVar23 != uVar25);
                  }
                }
                else {
                  uVar9 = *(ulong *)(iVar18 + uVar20 * 8);
                  uVar23 = uVar25 + 0x40;
                  if (iVar19 <= uVar25 + 0x40) {
                    uVar23 = iVar19;
                  }
                  uVar22 = uVar23;
                  if (uVar9 != 0) {
                    if (uVar9 == 0xffffffffffffffff) goto LAB_013ce8b4;
                    uVar22 = uVar25;
                    if (uVar25 < uVar23) {
                      uVar24 = 0;
                      do {
                        if ((uVar9 >> (uVar24 & 0x3f) & 1) != 0) {
                          *(uint *)(pdVar6 + uVar24 * 4 + uVar25 * 4) =
                               *(ushort *)(pdVar8 + uVar24 * 2 + uVar25 * 2) - uVar21;
                        }
                        uVar24 = uVar24 + 1;
                        uVar22 = uVar23;
                      } while (uVar23 - uVar25 != uVar24);
                    }
                  }
                }
                uVar20 = uVar20 + 1;
                uVar25 = uVar22;
              } while (uVar20 != iVar19 + 0x3f >> 6);
            }
          }
          DictionaryVector::VerifyDictionary(pvVar14);
          pVVar15 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(local_88);
          iVar19 = optional_idx::GetIndex((optional_idx *)&local_78);
          Vector::Dictionary(result,result,iVar19,(SelectionVector *)(pVVar15 + 1),count);
          return;
        }
      }
    }
    else if (VVar1 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      piVar3 = (int *)result->data;
      puVar4 = (ushort *)pvVar14->data;
      puVar5 = (pvVar14->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      *piVar3 = *puVar4 - uVar21;
      return;
    }
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(pvVar14,count,&local_78);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pSVar13 = local_78.sel;
    pdVar6 = result->data;
    FlatVector::VerifyFlatVector(result);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        p_Var7 = (allocate_function_ptr_t)pSVar13->sel_vector;
        iVar19 = 0;
        do {
          iVar18 = iVar19;
          if (p_Var7 != (allocate_function_ptr_t)0x0) {
            iVar18 = (idx_t)*(uint *)(p_Var7 + iVar19 * 4);
          }
          *(uint *)(pdVar6 + iVar19 * 4) = *(ushort *)(local_78.data + iVar18 * 2) - uVar21;
          iVar19 = iVar19 + 1;
        } while (count != iVar19);
      }
    }
    else if (count != 0) {
      p_Var7 = (allocate_function_ptr_t)pSVar13->sel_vector;
      uVar25 = 0;
      do {
        uVar20 = uVar25;
        if (p_Var7 != (allocate_function_ptr_t)0x0) {
          uVar20 = (ulong)*(uint *)(p_Var7 + uVar25 * 4);
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar20 >> 6]
             >> (uVar20 & 0x3f) & 1) == 0) {
          _Var17._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var17._M_head_impl == (unsigned_long *)0x0) {
            local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_a8,&local_80);
            p_Var12 = p_Stack_a0;
            peVar11 = local_a8;
            local_a8 = (element_type *)0x0;
            p_Stack_a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = peVar11;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = p_Var12;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               p_Stack_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a0);
            }
            pTVar16 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                  validity_data);
            _Var17._M_head_impl =
                 (pTVar16->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var17._M_head_impl;
          }
          bVar10 = (byte)uVar25 & 0x3f;
          _Var17._M_head_impl[uVar25 >> 6] =
               _Var17._M_head_impl[uVar25 >> 6] &
               (-2L << bVar10 | 0xfffffffffffffffeU >> 0x40 - bVar10);
        }
        else {
          *(uint *)(pdVar6 + uVar25 * 4) =
               (uint)*(ushort *)(local_78.data + uVar20 * 2) - (uint)uVar2;
        }
        uVar25 = uVar25 + 1;
      } while (count != uVar25);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void IntegralCompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 2);
	D_ASSERT(args.data[1].GetVectorType() == VectorType::CONSTANT_VECTOR);
	const auto min_val = ConstantVector::GetData<INPUT_TYPE>(args.data[1])[0];
	UnaryExecutor::Execute<INPUT_TYPE, RESULT_TYPE>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) {
		    return TemplatedIntegralCompress<INPUT_TYPE, RESULT_TYPE>::Operation(input, min_val);
	    },
	    FunctionErrors::CANNOT_ERROR);
}